

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::AnyMetadata::InternalIs(AnyMetadata *this,Descriptor *descriptor)

{
  bool bVar1;
  __type _Var2;
  string full_name;
  string type_url;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)this->type_url_->ptr_);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar1 = ParseAnyTypeUrl(&local_30,&local_50);
  if (bVar1) {
    _Var2 = std::operator==(&local_50,
                            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (descriptor + 8));
  }
  else {
    _Var2 = false;
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var2;
}

Assistant:

bool AnyMetadata::InternalIs(const Descriptor* descriptor) const {
  const string type_url = type_url_->GetNoArena();
  string full_name;
  if (!ParseAnyTypeUrl(type_url, &full_name)) {
    return false;
  }
  return full_name == descriptor->full_name();
}